

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

int __thiscall re2::RE2::NumberOfCapturingGroups(RE2 *this)

{
  anon_class_8_1_8991fb9c local_18;
  RE2 *local_10;
  RE2 *this_local;
  
  local_18.this = this;
  local_10 = this;
  std::call_once<re2::RE2::NumberOfCapturingGroups()const::__0>(&this->num_captures_once_,&local_18)
  ;
  return this->num_captures_;
}

Assistant:

int RE2::NumberOfCapturingGroups() const {
  std::call_once(num_captures_once_, [this]() {
    if (suffix_regexp_ != NULL)
      num_captures_ = suffix_regexp_->NumCaptures();
  });
  return num_captures_;
}